

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::SegmentInfo::Parse(SegmentInfo *this)

{
  IMkvReader *pReader;
  bool bVar1;
  bool bVar2;
  double *pdVar3;
  long lVar4;
  longlong lVar5;
  long lVar6;
  char **str;
  long unaff_RBP;
  long stop;
  longlong size;
  longlong pos;
  longlong id;
  longlong local_70;
  long local_68;
  SegmentInfo *local_60;
  char **local_58;
  char **local_50;
  char **local_48;
  double *local_40;
  long local_38;
  
  pReader = this->m_pSegment->m_pReader;
  local_68 = this->m_start;
  stop = local_68 + this->m_size;
  this->m_timecodeScale = 1000000;
  local_40 = &this->m_duration;
  this->m_duration = -1.0;
  local_48 = &this->m_pTitleAsUTF8;
  local_50 = &this->m_pWritingAppAsUTF8;
  local_58 = &this->m_pMuxingAppAsUTF8;
  local_60 = this;
  do {
    if (stop <= local_68) {
      if (9.223372036854776e+18 < (double)local_60->m_timecodeScale * local_60->m_duration) {
        return -2;
      }
      return (ulong)(local_68 == stop) * 2 + -2;
    }
    lVar4 = ParseElementHeader(pReader,&local_68,stop,&local_38,&local_70);
    pdVar3 = local_40;
    if (lVar4 < 0) {
      bVar1 = false;
    }
    else {
      if (local_38 < 0x5741) {
        if (local_38 == 0x4489) {
          lVar6 = UnserializeFloat(pReader,local_68,local_70,local_40);
          bVar1 = *pdVar3 != 0.0;
          bVar2 = *pdVar3 <= 0.0;
          if (bVar2 && bVar1) {
            unaff_RBP = -2;
          }
          lVar4 = unaff_RBP;
          if (lVar6 < 0) {
            lVar4 = lVar6;
          }
          unaff_RBP = lVar4;
          if (lVar6 < 0 || bVar2 && bVar1) {
            bVar1 = false;
            goto LAB_0015adc3;
          }
        }
        else {
          str = local_58;
          if (local_38 == 0x4d80) goto LAB_0015ad40;
        }
      }
      else {
        str = local_50;
        if ((local_38 == 0x5741) || (str = local_48, local_38 == 0x7ba9)) {
LAB_0015ad40:
          lVar4 = UnserializeString(pReader,local_68,local_70,str);
          if (lVar4 != 0) {
LAB_0015ad4e:
            bVar1 = false;
            goto LAB_0015adc3;
          }
        }
        else if (local_38 == 0x2ad7b1) {
          lVar5 = UnserializeUInt(pReader,local_68,local_70);
          local_60->m_timecodeScale = lVar5;
          if (lVar5 < 1) {
            lVar4 = -2;
            goto LAB_0015ad4e;
          }
        }
      }
      lVar4 = unaff_RBP;
      local_68 = local_68 + local_70;
      bVar1 = local_68 <= stop;
      if (stop < local_68) {
        lVar4 = -2;
      }
    }
LAB_0015adc3:
    unaff_RBP = lVar4;
    if (!bVar1) {
      return lVar4;
    }
  } while( true );
}

Assistant:

long SegmentInfo::Parse() {
  assert(m_pMuxingAppAsUTF8 == NULL);
  assert(m_pWritingAppAsUTF8 == NULL);
  assert(m_pTitleAsUTF8 == NULL);

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;
  const long long stop = m_start + m_size;

  m_timecodeScale = 1000000;
  m_duration = -1;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvTimecodeScale) {
      m_timecodeScale = UnserializeUInt(pReader, pos, size);

      if (m_timecodeScale <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDuration) {
      const long status = UnserializeFloat(pReader, pos, size, m_duration);

      if (status < 0)
        return status;

      if (m_duration < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvMuxingApp) {
      const long status =
          UnserializeString(pReader, pos, size, m_pMuxingAppAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvWritingApp) {
      const long status =
          UnserializeString(pReader, pos, size, m_pWritingAppAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvTitle) {
      const long status = UnserializeString(pReader, pos, size, m_pTitleAsUTF8);

      if (status)
        return status;
    }

    pos += size;

    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  const double rollover_check = m_duration * m_timecodeScale;
  if (rollover_check > static_cast<double>(LLONG_MAX))
    return E_FILE_FORMAT_INVALID;

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;
}